

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O3

result_t * exttposeFunc(result_t *__return_storage_ptr__,Env *env,ExttposeArgument *args)

{
  ostringstream *poVar1;
  ostream *poVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  Exttpose exttpose;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  Exttpose local_180;
  
  poVar1 = &env->logger;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"CONF ",5);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar1,args->DBASE_NUM_TRANS);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,args->DBASE_MAXITEM);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>((double)args->DBASE_AVG_TRANS_SZ);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>((double)args->DBASE_AVG_CUST_SZ);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (args->use_diff != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"SEQ TURNED OFF and PARTITIONS = 1\n",0x22);
  }
  lVar3 = lround((double)args->DBASE_NUM_TRANS * args->MINSUP_PER + 0.5);
  lVar5 = 1;
  if (1 < lVar3) {
    lVar5 = lVar3;
  }
  if (args->write_only_fcnt != 0) {
    lVar5 = lVar3;
  }
  args->MINSUPPORT = lVar5;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"args.MINSUPPORT ",0x10);
  poVar2 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  plVar4 = (long *)std::ostream::operator<<((ostream *)poVar2,args->DBASE_NUM_TRANS);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  poVar1 = &env->summary;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"TPOSE",5);
  if (args->use_diff != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," DIFF",5);
  }
  if (args->use_seq != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," SEQ",4);
  }
  if (args->do_invert == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," NOINVERT",9);
  }
  if (args->do_l2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," NOF2",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(args->input)._M_dataplus._M_p,
                      (args->input)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>(args->MINSUP_PER);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,args->DBASE_NUM_TRANS);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::operator<<((ostream *)poVar2,args->num_partitions);
  Exttpose::Exttpose(&local_180,env,args);
  Exttpose::tpose(&local_180);
  (__return_storage_ptr__->seqstrm)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->seqstrm).field_2;
  (__return_storage_ptr__->seqstrm)._M_string_length = 0;
  (__return_storage_ptr__->seqstrm).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->logger)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->logger).field_2;
  (__return_storage_ptr__->logger)._M_string_length = 0;
  (__return_storage_ptr__->logger).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->summary)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->summary).field_2;
  (__return_storage_ptr__->summary)._M_string_length = 0;
  (__return_storage_ptr__->summary).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->logger,(string *)local_1a0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->summary,(string *)local_1a0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  Exttpose::~Exttpose(&local_180);
  return __return_storage_ptr__;
}

Assistant:

result_t exttposeFunc(Env &env, ExttposeArgument &args) {
    env.logger << "CONF " << args.DBASE_NUM_TRANS << " " << args.DBASE_MAXITEM << " "
               << args.DBASE_AVG_TRANS_SZ << " " << args.DBASE_AVG_CUST_SZ << endl;

    if (args.use_diff) {
        env.logger << "SEQ TURNED OFF and PARTITIONS = 1\n";
    }

    args.MINSUPPORT = lround(args.MINSUP_PER * args.DBASE_NUM_TRANS + 0.5);

    //ensure that support is at least 2
    if (!args.write_only_fcnt && args.MINSUPPORT < 1) args.MINSUPPORT = 1;
    env.logger << "args.MINSUPPORT " << args.MINSUPPORT << " " << args.DBASE_NUM_TRANS << endl;

    env.summary << "TPOSE";
    if (args.use_diff) env.summary << " DIFF";
    if (args.use_seq) env.summary << " SEQ";
    if (!args.do_invert) env.summary << " NOINVERT";
    if (!args.do_l2) env.summary << " NOF2";
    env.summary << " " << args.input << " " << args.MINSUP_PER << " " << args.DBASE_NUM_TRANS << " "
                << args.MINSUPPORT << " " << args.num_partitions;

    Exttpose exttpose(env, args);
    exttpose.tpose();

    result_t result;
    result.logger = env.logger.str();
    result.summary = env.summary.str();
    return result;
}